

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadBranchElimPass::EraseDeadBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *unreachable_merges,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  size_type sVar5;
  pointer pvVar6;
  pointer pvVar7;
  Instruction *pIVar8;
  reference pvVar9;
  DefUseManager *this_00;
  IRContext *pIVar10;
  size_type sVar11;
  Operand *local_1d0;
  reference local_190;
  initializer_list<spvtools::opt::Operand> local_188;
  int local_174 [3];
  IRContext *local_168;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_160
  ;
  undefined1 local_158 [16];
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_148;
  undefined1 local_140 [20];
  uint32_t local_12c;
  _func_int **local_128;
  IRContext *local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  Operand local_f0;
  undefined1 local_c0 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_98;
  reference local_90;
  undefined1 local_88 [16];
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_78;
  _Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
  local_70;
  uint32_t local_64;
  reference pvStack_60;
  uint32_t cont_id;
  iterator local_58;
  undefined1 local_48 [8];
  iterator ebi;
  bool modified;
  unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
  *unreachable_continues_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *unreachable_merges_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *live_blocks_local;
  Function *func_local;
  DeadBranchElimPass *this_local;
  
  ebi.iterator_._M_current._7_1_ = 0;
  _local_48 = opt::Function::begin(func);
  do {
    while( true ) {
      local_58 = opt::Function::end(func);
      bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48,&local_58)
      ;
      if (!bVar1) {
        return (bool)(ebi.iterator_._M_current._7_1_ & 1);
      }
      pvStack_60 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      sVar5 = std::
              unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
              ::count(unreachable_continues,&stack0xffffffffffffffa0);
      if (sVar5 != 0) break;
      local_148._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      sVar11 = std::
               unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
               ::count(unreachable_merges,(key_type *)&local_148);
      if (sVar11 == 0) {
        local_190 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
        sVar11 = std::
                 unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                 ::count(live_blocks,&local_190);
        if (sVar11 == 0) {
          pvVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          MemPass::KillAllInsts(&this->super_MemPass,pvVar9,true);
          _local_48 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::Erase<false>
                                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          ebi.iterator_._M_current._7_1_ = 1;
        }
        else {
          UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
        }
      }
      else {
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
        BasicBlock::begin((BasicBlock *)(local_158 + 8));
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
        BasicBlock::tail((BasicBlock *)local_158);
        bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_158 + 8),
                                  (iterator_template<spvtools::opt::Instruction> *)local_158);
        bVar1 = true;
        if (!bVar2) {
          pvVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          pIVar8 = BasicBlock::terminator(pvVar7);
          OVar3 = opt::Instruction::opcode(pIVar8);
          bVar1 = OVar3 != OpUnreachable;
        }
        if (bVar1) {
          pvVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          MemPass::KillAllInsts(&this->super_MemPass,pvVar9,false);
          pvVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          local_168 = Pass::context((Pass *)this);
          local_174[2] = 0xff;
          local_174[1] = 0;
          local_174[0] = 0;
          std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_188);
          MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                    ((spvtools *)&local_160,&local_168,(Op *)(local_174 + 2),local_174 + 1,local_174
                     ,&local_188);
          BasicBlock::AddInstruction(pvVar7,&local_160);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_160);
          pIVar10 = Pass::context((Pass *)this);
          pvVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          pIVar8 = BasicBlock::terminator(pvVar7);
          IRContext::AnalyzeUses(pIVar10,pIVar8);
          pIVar10 = Pass::context((Pass *)this);
          pvVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          pIVar8 = BasicBlock::terminator(pvVar7);
          pvVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
          IRContext::set_instr_block(pIVar10,pIVar8,pvVar9);
          ebi.iterator_._M_current._7_1_ = 1;
        }
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      }
    }
    local_78._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
         UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                   ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
         ::find(unreachable_continues,(key_type *)&local_78);
    pvVar6 = std::__detail::
             _Node_const_iterator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false,_false>
                           *)&local_70);
    local_64 = BasicBlock::id(pvVar6->second);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
    BasicBlock::begin((BasicBlock *)(local_88 + 8));
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
    BasicBlock::tail((BasicBlock *)local_88);
    bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_88 + 8),
                              (iterator_template<spvtools::opt::Instruction> *)local_88);
    bVar1 = true;
    if (!bVar2) {
      pvVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      pIVar8 = BasicBlock::terminator(pvVar7);
      OVar3 = opt::Instruction::opcode(pIVar8);
      bVar1 = true;
      if (OVar3 == OpBranch) {
        pvVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                           ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
        pIVar8 = BasicBlock::terminator(pvVar7);
        uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar8,0);
        bVar1 = uVar4 != local_64;
      }
    }
    if (bVar1) {
      pvVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      MemPass::KillAllInsts(&this->super_MemPass,pvVar9,false);
      local_90 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                           ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      sVar5 = std::
              unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
              ::count(unreachable_continues,&local_90);
      if (sVar5 == 0) {
        __assert_fail("unreachable_continues.count(&*ebi)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp"
                      ,0x17e,
                      "bool spvtools::opt::DeadBranchElimPass::EraseDeadBlocks(Function *, const std::unordered_set<BasicBlock *> &, const std::unordered_set<BasicBlock *> &, const std::unordered_map<BasicBlock *, BasicBlock *> &)"
                     );
      }
      pvVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      local_c0._32_8_ = Pass::context((Pass *)this);
      local_c0[0x1c] = -7;
      local_c0[0x1d] = '\0';
      local_c0[0x1e] = '\0';
      local_c0[0x1f] = '\0';
      local_c0[0x18] = '\0';
      local_c0[0x19] = '\0';
      local_c0[0x1a] = '\0';
      local_c0[0x1b] = '\0';
      local_c0._20_4_ = 0;
      local_12c = local_64;
      local_128 = (_func_int **)&local_12c;
      local_120 = (IRContext *)0x1;
      init_list._M_len = 1;
      init_list._M_array = (iterator)local_128;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list);
      Operand::Operand(&local_f0,SPV_OPERAND_TYPE_ID,&local_118);
      local_c0._0_8_ = &local_f0;
      local_c0._8_8_ = (_func_int **)0x1;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_98,(IRContext **)(local_c0 + 0x20),(Op *)(local_c0 + 0x1c),
                 (int *)(local_c0 + 0x18),(int *)(local_c0 + 0x14),
                 (initializer_list<spvtools::opt::Operand> *)local_c0);
      BasicBlock::AddInstruction(pvVar7,&local_98);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_98);
      local_1d0 = (Operand *)local_c0;
      do {
        local_1d0 = local_1d0 + -1;
        Operand::~Operand(local_1d0);
      } while (local_1d0 != &local_f0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
      this_00 = Pass::get_def_use_mgr((Pass *)this);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      BasicBlock::tail((BasicBlock *)(local_140 + 8));
      pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)(local_140 + 8));
      analysis::DefUseManager::AnalyzeInstUse(this_00,pIVar8);
      pIVar10 = Pass::context((Pass *)this);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      BasicBlock::tail((BasicBlock *)local_140);
      pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)local_140);
      pvVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
      IRContext::set_instr_block(pIVar10,pIVar8,pvVar9);
      ebi.iterator_._M_current._7_1_ = 1;
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
  } while( true );
}

Assistant:

bool DeadBranchElimPass::EraseDeadBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_set<BasicBlock*>& unreachable_merges,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (unreachable_continues.count(&*ebi)) {
      uint32_t cont_id = unreachable_continues.find(&*ebi)->second->id();
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpBranch ||
          ebi->terminator()->GetSingleWordInOperand(0u) != cont_id) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unconditional branch to header.
        assert(unreachable_continues.count(&*ebi));
        ebi->AddInstruction(MakeUnique<Instruction>(
            context(), spv::Op::OpBranch, 0, 0,
            std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {cont_id}}}));
        get_def_use_mgr()->AnalyzeInstUse(&*ebi->tail());
        context()->set_instr_block(&*ebi->tail(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (unreachable_merges.count(&*ebi)) {
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpUnreachable) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unreachable terminator.
        ebi->AddInstruction(
            MakeUnique<Instruction>(context(), spv::Op::OpUnreachable, 0, 0,
                                    std::initializer_list<Operand>{}));
        context()->AnalyzeUses(ebi->terminator());
        context()->set_instr_block(ebi->terminator(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (!live_blocks.count(&*ebi)) {
      // Kill this block.
      KillAllInsts(&*ebi);
      ebi = ebi.Erase();
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}